

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O3

bool arangodb::velocypack::Collection::contains(Slice slice,Slice other)

{
  bool bVar1;
  ArrayIterator it;
  uint8_t *local_50;
  uint8_t *local_48;
  ArrayIterator local_40;
  
  local_48 = other._start;
  ArrayIterator::ArrayIterator(&local_40,slice);
  if (local_40._position == local_40._size) {
    bVar1 = false;
  }
  else {
    do {
      local_50 = (uint8_t *)ArrayIterator::value(&local_40);
      bVar1 = SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
              binaryEquals<arangodb::velocypack::Slice,arangodb::velocypack::Slice>
                        ((SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                         &local_50,
                         (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                         &local_48);
      if (bVar1) {
        return bVar1;
      }
      ArrayIterator::next(&local_40);
    } while (local_40._position != local_40._size);
  }
  return bVar1;
}

Assistant:

bool Collection::contains(Slice slice, Slice other) {
  ArrayIterator it(slice);

  while (it.valid()) {
    if (it.value().binaryEquals(other)) {
      return true;
    }
    it.next();
  }

  return false;
}